

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::UpdateImageObject
               (Image *image,string *baseDir,int index,bool embedImages,
               WriteImageDataFunction *WriteImageData,void *user_data)

{
  long lVar1;
  string local_1c0 [8];
  string uri;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  string local_90;
  undefined1 local_70 [8];
  string ext;
  string filename;
  void *user_data_local;
  WriteImageDataFunction *WriteImageData_local;
  bool embedImages_local;
  int index_local;
  string *baseDir_local;
  Image *image_local;
  
  std::__cxx11::string::string((string *)(ext.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_70);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    lVar1 = std::__cxx11::string::size();
    if (lVar1 == 0) {
      MimeToExt(&local_140,&image->mimeType);
      std::__cxx11::string::operator=((string *)local_70,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::to_string((string *)((long)&uri.field_2 + 8),index);
      std::operator+(&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&uri.field_2 + 8),".");
      std::operator+(&local_160,&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::__cxx11::string::operator=((string *)(ext.field_2._M_local_buf + 8),(string *)&local_160)
      ;
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)(uri.field_2._M_local_buf + 8));
    }
    else {
      MimeToExt(&local_e0,&image->mimeType);
      std::__cxx11::string::operator=((string *)local_70,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::operator+(&local_120,&image->name,".");
      std::operator+(&local_100,&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::__cxx11::string::operator=((string *)(ext.field_2._M_local_buf + 8),(string *)&local_100)
      ;
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
    }
  }
  else {
    GetBaseFilename(&local_90,&image->uri);
    std::__cxx11::string::operator=((string *)(ext.field_2._M_local_buf + 8),(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    GetFilePathExtension(&local_c0,(string *)(ext.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if (*WriteImageData != (WriteImageDataFunction)0x0) {
    std::__cxx11::string::string(local_1c0);
    (**WriteImageData)(baseDir,(string *)((long)&ext.field_2 + 8),image,embedImages,user_data);
    std::__cxx11::string::~string(local_1c0);
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
  return;
}

Assistant:

static void UpdateImageObject(Image &image, std::string &baseDir, int index,
                              bool embedImages,
                              WriteImageDataFunction *WriteImageData = nullptr,
                              void *user_data = nullptr) {
  std::string filename;
  std::string ext;

  // If image have uri. Use it it as a filename
  if (image.uri.size()) {
    filename = GetBaseFilename(image.uri);
    ext = GetFilePathExtension(filename);

  } else if (image.name.size()) {
    ext = MimeToExt(image.mimeType);
    // Otherwise use name as filename
    filename = image.name + "." + ext;
  } else {
    ext = MimeToExt(image.mimeType);
    // Fallback to index of image as filename
    filename = std::to_string(index) + "." + ext;
  }

  // If callback is set, modify image data object
  if (*WriteImageData != nullptr) {
    std::string uri;
    (*WriteImageData)(&baseDir, &filename, &image, embedImages, user_data);
  }
}